

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O3

void av1_setup_block_planes(MACROBLOCKD *xd,int ss_x,int ss_y,int num_planes)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  if (0 < num_planes) {
    lVar2 = 0;
    do {
      *(bool *)((long)xd->plane[0].pre + lVar2 + -0x30) = lVar2 != 0;
      iVar4 = ss_y;
      iVar3 = ss_x;
      if (lVar2 == 0) {
        iVar3 = 0;
        iVar4 = 0;
      }
      *(int *)((long)xd->plane[0].pre + lVar2 + -0x2c) = iVar3;
      *(int *)((long)xd->plane[0].pre + lVar2 + -0x28) = iVar4;
      lVar2 = lVar2 + 0xa30;
    } while ((ulong)(uint)num_planes * 0xa30 - lVar2 != 0);
    if (2 < num_planes) {
      return;
    }
  }
  lVar2 = (long)num_planes;
  piVar1 = &xd->plane[lVar2].subsampling_y;
  do {
    lVar2 = lVar2 + 1;
    *(undefined8 *)(piVar1 + -1) = 0x100000001;
    piVar1 = piVar1 + 0x28c;
  } while ((int)lVar2 != 3);
  return;
}

Assistant:

void av1_setup_block_planes(MACROBLOCKD *xd, int ss_x, int ss_y,
                            const int num_planes) {
  int i;

  for (i = 0; i < num_planes; i++) {
    xd->plane[i].plane_type = get_plane_type(i);
    xd->plane[i].subsampling_x = i ? ss_x : 0;
    xd->plane[i].subsampling_y = i ? ss_y : 0;
  }
  for (i = num_planes; i < MAX_MB_PLANE; i++) {
    xd->plane[i].subsampling_x = 1;
    xd->plane[i].subsampling_y = 1;
  }
}